

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_rEr.cpp
# Opt level: O2

vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_> *
DronePoseLib::ValtonenOrnhagArxiv2021Extra::get_rEr
          (vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>
           *__return_storage_ptr__,MatrixXd *p1,MatrixXd *p2,Matrix3d *R1,Matrix3d *R2,
          double focal_length)

{
  double dVar1;
  uint __line;
  CommaInitializer<Eigen::Matrix<double,_22,_1,_0,_22,_1>_> *pCVar2;
  Scalar *pSVar3;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar4;
  long lVar5;
  int i;
  long index;
  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *pCVar6;
  Matrix3d *pMVar7;
  char *__assertion;
  byte bVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double scale;
  vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_> *local_4d8;
  double focal_length_local;
  Scalar local_4c8;
  double local_4c0;
  MatrixXd pp2;
  MatrixXd pp1;
  Product<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::DiagonalMatrix<double,_3,_3>,_1>
  local_488;
  double local_448;
  Scalar local_440;
  double local_438;
  double local_430;
  DiagonalMatrix<double,_3,_3> Kinv;
  Matrix<double,_5,_1,_0,_5,_1> coeffs;
  RelPose relpose;
  Vector3d kinv;
  Vector4cd r;
  Matrix3d R;
  Matrix3d skew_t;
  Matrix3d Q;
  Matrix3d M;
  Matrix<double,_22,_1,_0,_22,_1> x;
  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> qr;
  
  bVar8 = 0;
  local_4d8 = __return_storage_ptr__;
  focal_length_local = focal_length;
  if ((p1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows == 2)
  {
    if ((p2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows == 2
       ) {
      if ((p1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols ==
          3) {
        if ((p2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
            == 3) {
          local_448 = normalize2dpts(p1);
          dVar1 = normalize2dpts(p2);
          uVar9 = SUB84(dVar1,0);
          uVar10 = (undefined4)((ulong)dVar1 >> 0x20);
          if (dVar1 <= local_448) {
            uVar9 = SUB84(local_448,0);
            uVar10 = (undefined4)((ulong)local_448 >> 0x20);
          }
          scale = (double)CONCAT44(uVar10,uVar9);
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,__1,_0> *)&pp1,
                     (DenseStorage<double,__1,__1,__1,_0> *)p1);
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,__1,_0> *)&pp2,
                     (DenseStorage<double,__1,__1,__1,_0> *)p2);
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator*=
                    ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&pp1,&scale);
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator*=
                    ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&pp2,&scale);
          focal_length_local = scale * focal_length_local;
          qr.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[0] = (double)R2;
          qr.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[1] = (double)R1;
          Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
          _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,0>>
                    ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&R,
                     (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
                      *)&qr);
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&qr,&pp1,0);
          Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::
          CommaInitializer<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                    ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)&Kinv,&x,
                     (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                      *)&qr);
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&relpose,&pp1,1
                    );
          pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)&Kinv,
                              (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                               *)&relpose);
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&M,&pp1,2);
          pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)pCVar2,
                              (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                               *)&M);
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&Q,&pp2,0);
          pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)pCVar2,
                              (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                               *)&Q);
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&skew_t,&pp2,1)
          ;
          pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)pCVar2,
                              (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                               *)&skew_t);
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&r,&pp2,2);
          pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)pCVar2,
                              (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                               *)&r);
          Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
          BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *
                          )&local_488,&R,0);
          pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)pCVar2,
                              (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                               *)&local_488);
          Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
          BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *
                          )&coeffs,&R,1);
          pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)pCVar2,
                              (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                               *)&coeffs);
          Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
          BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *
                          )&kinv,&R,2);
          pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)pCVar2,
                              (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                               *)&kinv);
          Eigen::CommaInitializer<Eigen::Matrix<double,_22,_1,_0,_22,_1>_>::operator_
                    (pCVar2,&focal_length_local);
          Eigen::CommaInitializer<Eigen::Matrix<double,_22,_1,_0,_22,_1>_>::finished
                    ((CommaInitializer<Eigen::Matrix<double,_22,_1,_0,_22,_1>_> *)&Kinv);
          calculate_coefficients(&coeffs,&x);
          solve_quartic(&r,coeffs.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                           m_storage.m_data.array[1] /
                           coeffs.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                           m_storage.m_data.array[0],
                        coeffs.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                        m_storage.m_data.array[2] /
                        coeffs.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                        m_storage.m_data.array[0],
                        coeffs.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                        m_storage.m_data.array[3] /
                        coeffs.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                        m_storage.m_data.array[0],
                        coeffs.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                        m_storage.m_data.array[4] /
                        coeffs.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                        m_storage.m_data.array[0]);
          (local_4d8->
          super__Vector_base<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>)._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          (local_4d8->
          super__Vector_base<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>)._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          (local_4d8->
          super__Vector_base<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>)._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          index = 0;
          while( true ) {
            if (index == 4) break;
            pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1>::
                     operator[]((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1>
                                 *)&r,index);
            if (ABS(*(double *)(pSVar3->_M_value + 8)) < 1e-12) {
              pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1>
                       ::operator[]((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1>
                                     *)&r,index);
              create_M((Matrix3d *)&qr,*(double *)pSVar3->_M_value,&x);
              local_488.m_lhs.m_lhs.m_lhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
                   = (double)&M;
              pCVar6 = &qr;
              pMVar7 = (Matrix3d *)
                       local_488.m_lhs.m_lhs.m_lhs.m_diagonal.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[0];
              for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
                (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data.array[0] =
                     (pCVar6->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[0];
                pCVar6 = (ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)
                         ((long)pCVar6 + (ulong)bVar8 * -0x10 + 8);
                pMVar7 = (Matrix3d *)((long)pMVar7 + ((ulong)bVar8 * -2 + 1) * 8);
              }
              Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>::
              colPivHouseholderQr(&qr,(MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                       *)&local_488);
              Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::householderQ
                        ((HouseholderSequenceType *)&local_488,&qr);
              Eigen::
              HouseholderSequence<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,1,0,3,1>,1>
              ::evalTo<Eigen::Matrix<double,3,3,0,3,3>>
                        ((HouseholderSequence<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,1,0,3,1>,1>
                          *)&local_488,&Q);
              Eigen::internal::
              BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
              BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>
                               *)&local_488,&Q,2);
              Eigen::internal::
              call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
                        (&relpose.t,
                         (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&local_488);
              relpose.f = focal_length_local / scale;
              pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1>
                       ::operator[]((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1>
                                     *)&r,index);
              relpose.r = scale * scale * *(double *)pSVar3->_M_value;
              local_4c0 = 1.0 / relpose.f;
              local_488.m_lhs.m_lhs.m_lhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
                   = 0.0;
              local_488.m_lhs.m_lhs.m_lhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
                   = 4.94065645841247e-324;
              local_488.m_lhs.m_lhs.m_rhs = (RhsNested)0x1;
              local_488.m_lhs.m_lhs.m_lhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
                   = (double)&kinv;
              kinv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] = local_4c0;
              this = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                               ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                &local_488,&local_4c0);
              local_4c8 = 1.0;
              Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                        (this,&local_4c8);
              Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished
                        ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_488);
              Eigen::internal::
              call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
                        (&Kinv.m_diagonal,&kinv);
              local_488.m_lhs.m_lhs.m_lhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
                   = 0.0;
              local_488.m_lhs.m_lhs.m_lhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
                   = 4.94065645841247e-324;
              skew_t.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array[0] = 0.0;
              local_488.m_lhs.m_lhs.m_rhs = (RhsNested)0x1;
              local_4c0 = -relpose.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[2];
              local_488.m_lhs.m_lhs.m_lhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
                   = (double)&skew_t;
              pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                                 ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                                  &local_488,&local_4c0);
              pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                                 (pCVar4,relpose.t.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                         .m_storage.m_data.array + 1);
              pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                                 (pCVar4,relpose.t.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                         .m_storage.m_data.array + 2);
              local_4c8 = 0.0;
              pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                                 (pCVar4,&local_4c8);
              local_430 = -relpose.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[0];
              pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                                 (pCVar4,&local_430);
              local_438 = -relpose.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[1];
              pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                                 (pCVar4,&local_438);
              pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                                 (pCVar4,(Scalar *)&relpose.t);
              local_440 = 0.0;
              Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                        (pCVar4,&local_440);
              Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::finished
                        ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_488);
              local_488.m_lhs.m_lhs.m_lhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
                   = Kinv.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2];
              local_488.m_lhs.m_lhs.m_lhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
                   = Kinv.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0];
              local_488.m_lhs.m_lhs.m_lhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
                   = Kinv.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1];
              local_488.m_lhs.m_rhs = &R;
              local_488.m_rhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
                   = Kinv.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2];
              local_488.m_rhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
                   = Kinv.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0];
              local_488.m_rhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
                   = Kinv.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1];
              local_488.m_lhs.m_lhs.m_rhs = &skew_t;
              Eigen::internal::
              call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Product<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,3,3>,Eigen::Matrix<double,3,3,0,3,3>,1>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::DiagonalMatrix<double,3,3>,1>>
                        (&relpose.F,&local_488);
              std::vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>::push_back
                        (local_4d8,&relpose);
            }
            index = index + 1;
          }
          free(pp2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
              );
          free(pp1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
              );
          return local_4d8;
        }
        __assertion = "p2.cols() == nbr_pts";
        __line = 0x31;
      }
      else {
        __assertion = "p1.cols() == nbr_pts";
        __line = 0x30;
      }
    }
    else {
      __assertion = "p2.rows() == 2";
      __line = 0x2f;
    }
  }
  else {
    __assertion = "p1.rows() == 2";
    __line = 0x2e;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/DronePoseLib/src/solvers/valtonenornhag_arxiv_2021/rEr/get_rEr.cpp"
                ,__line,
                "std::vector<RelPose> DronePoseLib::ValtonenOrnhagArxiv2021Extra::get_rEr(const Eigen::MatrixXd &, const Eigen::MatrixXd &, const Eigen::Matrix3d &, const Eigen::Matrix3d &, double)"
               );
}

Assistant:

std::vector<RelPose> get_rEr(
        const Eigen::MatrixXd &p1,
        const Eigen::MatrixXd &p2,
        const Eigen::Matrix3d &R1,
        const Eigen::Matrix3d &R2,
        double focal_length
    ) {
        // This is a 3-point method
        int nbr_pts = 3;

        // We expect inhomogenous input data, i.e. p1 and p2 are 2x3 matrices
        assert(p1.rows() == 2);
        assert(p2.rows() == 2);
        assert(p1.cols() == nbr_pts);
        assert(p2.cols() == nbr_pts);

        // Compute normalization matrix
        double scale1 = normalize2dpts(p1);
        double scale2 = normalize2dpts(p2);
        double scale = std::max(scale1, scale2);

        // Make a copy
        Eigen::MatrixXd pp1 = p1;
        Eigen::MatrixXd pp2 = p2;
        pp1 *= scale;
        pp2 *= scale;
        focal_length *= scale;

        // Compute relative rotation
        Eigen::Matrix3d R = R2 * R1.transpose();

        Eigen::Matrix<double, 22, 1> x;
        x << pp1.col(0), pp1.col(1), pp1.col(2),
             pp2.col(0), pp2.col(1), pp2.col(2),
             R.col(0), R.col(1), R.col(2), focal_length;

        Eigen::Matrix<double, 5, 1> coeffs = calculate_coefficients(x);

        Eigen::Vector4cd r  = solve_quartic(
            coeffs(1) / coeffs(0),
            coeffs(2) / coeffs(0),
            coeffs(3) / coeffs(0),
            coeffs(4) / coeffs(0));

        // Construct putative output
        double thresh = 1e-12;
        Eigen::Matrix3d M;
        std::vector<RelPose> output;
        RelPose relpose;
        Eigen::Matrix3d Q;
        Eigen::Vector3d kinv;
        Eigen::DiagonalMatrix<double, 3> Kinv;
        Eigen::Matrix3d skew_t;

        // Householder is just 500 ns slower than null3, but is significantly more stable
        for (int i=0; i < r.size(); i++) {
            if (std::abs(std::imag(r[i])) < thresh) {
                M = create_M(std::real(r[i]), x);
                auto qr = M.transpose().colPivHouseholderQr();
                Q = qr.householderQ();
                relpose.t = Q.col(2);
                relpose.f = focal_length / scale;
                relpose.r = std::real(r[i]) * std::pow(scale, 2);

                // Compute fundamental matrix
                kinv << 1.0 / relpose.f, 1.0 / relpose.f, 1.0;
                Kinv = kinv.asDiagonal();
                skew_t << 0, -relpose.t(2), relpose.t(1),
                          relpose.t(2), 0, -relpose.t(0),
                         -relpose.t(1), relpose.t(0), 0;
                relpose.F = Kinv * skew_t * R * Kinv;

                output.push_back(relpose);
            }
        }

        return output;
    }